

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O0

void __thiscall
osqp::anon_unknown_0::OsqpTest_TwoDimLPWithEquality_Test::TestBody
          (OsqpTest_TwoDimLPWithEquality_Test *this)

{
  double val1;
  initializer_list<double> v;
  initializer_list<double> v_00;
  bool bVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar2;
  char *pcVar3;
  char *message;
  char *in_R9;
  Span<const_double> expected;
  Span<const_double> expected_00;
  double local_478 [3];
  iterator local_460;
  undefined8 local_458;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *local_450;
  pointer local_448;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_440;
  double local_428 [2];
  iterator local_418;
  undefined8 local_410;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *local_408;
  pointer local_400;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_3f8;
  AssertHelper local_3e0;
  Message local_3d8;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_1;
  Message local_3b8;
  OsqpExitCode local_3b0;
  OsqpExitCode local_3ac;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar;
  string local_390;
  AssertHelper local_370;
  Message local_368;
  Status local_360;
  bool local_351;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_;
  OsqpSettings settings;
  OsqpSolver solver;
  Scalar local_290;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_288;
  Scalar local_268;
  Scalar local_260;
  double *local_258;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_250;
  StorageIndex *local_230;
  StorageIndex *local_228;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_220;
  SparseMatrix<double,_0,_int> local_200;
  undefined1 local_1b8 [8];
  OsqpInstance instance;
  Triplet<double,_int> *local_f0;
  double local_e8;
  int local_e0 [2];
  double local_d8;
  int local_d0 [2];
  double local_c8;
  int local_bc [5];
  double local_a8;
  int local_a0 [2];
  undefined1 local_98 [8];
  Triplet<double,_int> kTripletsA [4];
  SparseMatrix<double,_0,_int> constraint_matrix;
  OsqpTest_TwoDimLPWithEquality_Test *this_local;
  
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
            ((SparseMatrix<double,_0,_int> *)&kTripletsA[3].m_value,3,2);
  local_a0[1] = 0;
  local_a0[0] = 0;
  local_a8 = 1.0;
  Eigen::Triplet<double,_int>::Triplet
            ((Triplet<double,_int> *)local_98,local_a0 + 1,local_a0,&local_a8);
  local_bc[1] = 0;
  local_bc[0] = 1;
  local_c8 = 1.0;
  Eigen::Triplet<double,_int>::Triplet
            ((Triplet<double,_int> *)&kTripletsA[0].m_value,local_bc + 1,local_bc,&local_c8);
  local_d0[1] = 1;
  local_d0[0] = 0;
  local_d8 = 1.0;
  Eigen::Triplet<double,_int>::Triplet
            ((Triplet<double,_int> *)&kTripletsA[1].m_value,local_d0 + 1,local_d0,&local_d8);
  local_e0[1] = 2;
  local_e0[0] = 1;
  local_e8 = 1.0;
  Eigen::Triplet<double,_int>::Triplet
            ((Triplet<double,_int> *)&kTripletsA[2].m_value,local_e0 + 1,local_e0,&local_e8);
  local_f0 = std::begin<Eigen::Triplet<double,int>const,4ul>((Triplet<double,_int> (*) [4])local_98)
  ;
  instance.upper_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = (Index)std::end<Eigen::Triplet<double,int>const,4ul>
                            ((Triplet<double,_int> (*) [4])local_98);
  Eigen::SparseMatrix<double,0,int>::setFromTriplets<Eigen::Triplet<double,int>const*>
            ((SparseMatrix<double,0,int> *)&kTripletsA[3].m_value,&local_f0,
             (Triplet<double,_int> **)
             &instance.upper_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows);
  OsqpInstance::OsqpInstance((OsqpInstance *)local_1b8);
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix(&local_200,2,2);
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)local_1b8,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)&local_200);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix(&local_200);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.objective_matrix.m_data.m_allocatedSize,2);
  local_228 = (StorageIndex *)0xbff0000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_220,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.objective_matrix.m_data.m_allocatedSize,(Scalar *)&local_228);
  local_230 = (StorageIndex *)0x0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (&local_220,(Scalar *)&local_230);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_220);
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)
             &instance.objective_vector.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)&kTripletsA[3].m_value);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.constraint_matrix.m_data.m_allocatedSize,3);
  local_258 = (double *)0xfff0000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_250,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.constraint_matrix.m_data.m_allocatedSize,(Scalar *)&local_258);
  local_260 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_250,&local_260);
  local_268 = 0.5;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar2,&local_268);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_250);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.lower_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows,3);
  local_290 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_288,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.lower_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows,&local_290);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_288,(Scalar *)&(anonymous_namespace)::kInfinity);
  solver.workspace_._M_t.
  super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
  super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
  super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl =
       (unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>)
       (__uniq_ptr_data<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter,_true,_true>)
       0x3fe0000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar2,(Scalar *)&solver);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_288);
  OsqpSolver::OsqpSolver((OsqpSolver *)&settings.time_limit);
  OsqpSettings::OsqpSettings((OsqpSettings *)&gtest_ar_.message_);
  settings.max_iter = 0x3ee4f8b588e368f1;
  settings.eps_abs = 0.0;
  OsqpSolver::Init((OsqpSolver *)&local_360,(OsqpInstance *)&settings.time_limit,
                   (OsqpSettings *)local_1b8);
  local_351 = absl::Status::ok(&local_360);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_350,&local_351,(type *)0x0);
  absl::Status::~Status(&local_360);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_390,(internal *)local_350,
               (AssertionResult *)"solver.Init(instance, settings).ok()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0xbf,pcVar3);
    testing::internal::AssertHelper::operator=(&local_370,&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    testing::Message::~Message(&local_368);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_3ac = OsqpSolver::Solve((OsqpSolver *)&settings.time_limit);
    local_3b0 = kOptimal;
    testing::internal::EqHelper::Compare<osqp::OsqpExitCode,_osqp::OsqpExitCode,_nullptr>
              ((EqHelper *)local_3a8,"solver.Solve()","OsqpExitCode::kOptimal",&local_3ac,&local_3b0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
    if (!bVar1) {
      testing::Message::Message(&local_3b8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                 ,0xc0,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_3b8);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      val1 = OsqpSolver::objective_value((OsqpSolver *)&settings.time_limit);
      pcVar3 = "kTolerance";
      testing::internal::DoubleNearPredFormat
                ((internal *)local_3d0,"solver.objective_value()","-0.5","kTolerance",val1,-0.5,
                 1e-05);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
      if (!bVar1) {
        testing::Message::Message(&local_3d8);
        message = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
        pcVar3 = (char *)0xc2;
        testing::internal::AssertHelper::AssertHelper
                  (&local_3e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0xc2,message);
        testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
        testing::internal::AssertHelper::~AssertHelper(&local_3e0);
        testing::Message::~Message(&local_3d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
      OsqpSolver::primal_solution(&local_3f8,(OsqpSolver *)&settings.time_limit);
      local_428[0] = 0.5;
      local_428[1] = 0.5;
      local_418 = local_428;
      local_410 = 2;
      v_00._M_len = 2;
      v_00._M_array = local_418;
      absl::Span<double_const>::Span<double_const,double_const>
                ((Span<double_const> *)&local_408,v_00);
      expected.len_ = (size_type)pcVar3;
      expected.ptr_ = local_400;
      ExpectElementsAre((anon_unknown_0 *)&local_3f8,local_408,expected,1e-05);
      OsqpSolver::dual_solution(&local_440,(OsqpSolver *)&settings.time_limit);
      local_478[0] = 1.0;
      local_478[1] = 0.0;
      local_478[2] = -1.0;
      local_460 = local_478;
      local_458 = 3;
      v._M_len = 3;
      v._M_array = local_460;
      absl::Span<double_const>::Span<double_const,double_const>((Span<double_const> *)&local_450,v);
      expected_00.len_ = (size_type)pcVar3;
      expected_00.ptr_ = local_448;
      ExpectElementsAre((anon_unknown_0 *)&local_440,local_450,expected_00,1e-05);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  OsqpSolver::~OsqpSolver((OsqpSolver *)&settings.time_limit);
  OsqpInstance::~OsqpInstance((OsqpInstance *)local_1b8);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
            ((SparseMatrix<double,_0,_int> *)&kTripletsA[3].m_value);
  return;
}

Assistant:

TEST(OsqpTest, TwoDimLPWithEquality) {
  // Minimize -x subject to:
  // x + y <= 1, x >= 0, y == 0.5.

  SparseMatrix<double> constraint_matrix(3, 2);
  const Triplet<double> kTripletsA[] = {
      {0, 0, 1.0}, {0, 1, 1.0}, {1, 0, 1.0}, {2, 1, 1.0}};
  constraint_matrix.setFromTriplets(std::begin(kTripletsA),
                                    std::end(kTripletsA));

  OsqpInstance instance;
  instance.objective_matrix = SparseMatrix<double>(2, 2);
  instance.objective_vector.resize(2);
  instance.objective_vector << -1.0, 0.0;
  instance.constraint_matrix = constraint_matrix;
  instance.lower_bounds.resize(3);
  instance.lower_bounds << -kInfinity, 0.0, 0.5;
  instance.upper_bounds.resize(3);
  instance.upper_bounds << 1.0, kInfinity, 0.5;

  OsqpSolver solver;
  OsqpSettings settings;
  settings.eps_abs = kTolerance;
  settings.eps_rel = 0.0;
  ASSERT_TRUE(solver.Init(instance, settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  EXPECT_NEAR(solver.objective_value(), -0.5, kTolerance);
  ExpectElementsAre(solver.primal_solution(), {0.5, 0.5}, kTolerance);
  ExpectElementsAre(solver.dual_solution(), {1.0, 0.0, -1.0}, kTolerance);
}